

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void dwr_death_necklace(dw_rom *rom)

{
  dw_rom *rom_local;
  
  if ((rom->flags[3] & 0x30) != 0) {
    printf("Adding functionality to the death necklace...\n");
    vpatch(rom,0xe260,1,0);
    vpatch(rom,0xff54,0x1f,0x24,0xcf,0x10,0x18,0xa5,0xca,0x46,0xca,0x46,0xca,0x38,0xe5,0xca,0x85,
           0xca,0xc5,0xc5,0xb0,2,0x85,0xc5,0x18,0xa5,0xcc,0x69,10,0x85,0xcc,0xa5,0xcf,0x60);
  }
  return;
}

Assistant:

static void dwr_death_necklace(dw_rom *rom)
{


    if (!DEATH_NECKLACE(rom))
        return;

    printf("Adding functionality to the death necklace...\n");

    vpatch(rom, 0xe260, 1, 0);  /* set death necklace chance to 100% */

    vpatch(rom, 0xff54, 31,
            /* ff54: */
            0x24, 0xcf,  /* AND #$80  ; check bit 8 (death necklace)       */
            0x10, 0x18,  /* BPL $FF71                                      */
            0xa5, 0xca,  /* LDA $00CA ; load max HP                        */
            0x46, 0xca,  /* LSR $00CA ; divide max HP by 4                 */
            0x46, 0xca,  /* LSR $00CA                                      */
            0x38,        /* SEC       ; Set the carry bit (no borrow)      */
            0xe5, 0xca,  /* SBC $00CA ; subtract the result                */
            0x85, 0xca,  /* STA $00CA ; rewrite max HP                     */
            0xc5, 0xc5,  /* CMP $00C5 ; compare to current HP              */
            0xb0, 0x02,  /* BCS $FF69                                      */
            0x85, 0xc5,  /* STA $00C5 ; set current HP to max HP           */
            /* ff69: */
            0x18,        /* CLC       ; Clear the carry bit                */
            0xa5, 0xcc,  /* LDA $00CC ; load attack power                  */
            0x69, 0x0a,  /* ADD #$0A  ; add 10                             */
            0x85, 0xcc,  /* STA $00CC ; rewrite attack power               */
            /* ff70: */
            0xa5, 0xcf,  /* LDA $00CF ; replaces code removed from $F00E   */
            0x60         /* RTS                                            */
        );
}